

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcLShapeProfileDef::IfcLShapeProfileDef(IfcLShapeProfileDef *this)

{
  IfcLShapeProfileDef *this_local;
  
  STEP::Object::Object((Object *)&this->field_0xf0,"IfcLShapeProfileDef");
  IfcParameterizedProfileDef::IfcParameterizedProfileDef
            (&this->super_IfcParameterizedProfileDef,&PTR_construction_vtable_24__0107b8a0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcLShapeProfileDef,_8UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcLShapeProfileDef,_8UL> *)
             &(this->super_IfcParameterizedProfileDef).field_0x70,
             &PTR_construction_vtable_24__0107b8e8);
  (this->super_IfcParameterizedProfileDef).super_IfcProfileDef.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x107b810;
  *(undefined8 *)&this->field_0xf0 = 0x107b888;
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).super_IfcProfileDef.field_0x58 =
       0x107b838;
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).field_0x70 = 0x107b860;
  STEP::Maybe<double>::Maybe(&this->Width);
  STEP::Maybe<double>::Maybe(&this->FilletRadius);
  STEP::Maybe<double>::Maybe(&this->EdgeRadius);
  STEP::Maybe<double>::Maybe(&this->LegSlope);
  STEP::Maybe<double>::Maybe(&this->CentreOfGravityInX);
  STEP::Maybe<double>::Maybe(&this->CentreOfGravityInY);
  return;
}

Assistant:

IfcLShapeProfileDef() : Object("IfcLShapeProfileDef") {}